

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::lookupTool
          (CAPIBuildSystemFrontendDelegate *this,StringRef name)

{
  code *pcVar1;
  _func_int **pp_Var2;
  llb_data_t cName;
  undefined1 local_18 [8];
  size_t local_10;
  
  local_10 = name.Length;
  pcVar1 = *(code **)(name.Data + 0x70);
  if (pcVar1 == (code *)0x0) {
    (this->super_BuildSystemFrontendDelegate).super_BuildSystemDelegate._vptr_BuildSystemDelegate =
         (_func_int **)0x0;
  }
  else {
    pp_Var2 = (_func_int **)(*pcVar1)(*(undefined8 *)(name.Data + 0x38),local_18);
    if (pp_Var2 == (_func_int **)0x0) {
      (this->super_BuildSystemFrontendDelegate).super_BuildSystemDelegate._vptr_BuildSystemDelegate
           = (_func_int **)0x0;
      pp_Var2 = (_func_int **)0x0;
    }
    (this->super_BuildSystemFrontendDelegate).super_BuildSystemDelegate._vptr_BuildSystemDelegate =
         pp_Var2;
  }
  return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Tool> lookupTool(StringRef name) override {
    if (!cAPIDelegate.lookup_tool) {
      return nullptr;
    }
    
    llb_data_t cName{ name.size(), (const uint8_t*) name.data() };
    auto tool = cAPIDelegate.lookup_tool(cAPIDelegate.context, &cName);
    if (!tool) {
      return nullptr;
    }

    return std::unique_ptr<Tool>((Tool*)tool);
  }